

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall
LowDiscrepancy_GeneratorMatrix_Test::~LowDiscrepancy_GeneratorMatrix_Test
          (LowDiscrepancy_GeneratorMatrix_Test *this)

{
  void *in_RDI;
  
  ~LowDiscrepancy_GeneratorMatrix_Test((LowDiscrepancy_GeneratorMatrix_Test *)0x654818);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(LowDiscrepancy, GeneratorMatrix) {
    uint32_t C[32];
    uint32_t Crev[32];
    // Identity matrix, column-wise
    for (int i = 0; i < 32; ++i) {
        C[i] = 1 << i;
        Crev[i] = ReverseBits32(C[i]);
    }

    for (int a = 0; a < 128; ++a) {
        // Make sure identity generator matrix matches van der Corput
        EXPECT_EQ(a, MultiplyGenerator(C, a));
        EXPECT_EQ(RadicalInverse(0, a),
                  ReverseBits32(MultiplyGenerator(C, a)) * 2.3283064365386963e-10f);
        EXPECT_EQ(RadicalInverse(0, a), SampleGeneratorMatrix(Crev, a));
    }

    // Random / goofball generator matrix
    RNG rng;
    for (int i = 0; i < 32; ++i) {
        C[i] = rng.Uniform<uint32_t>();
        Crev[i] = ReverseBits32(C[i]);
    }
    for (int a = 0; a < 1024; ++a) {
        EXPECT_EQ(ReverseBits32(MultiplyGenerator(C, a)), MultiplyGenerator(Crev, a));
    }
}